

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O0

wchar_t * do_mvis(wchar_t *dst,wint_t c,wchar_t flags,wint_t nextc,wchar_t *extra)

{
  int iVar1;
  wchar_t *pwVar2;
  wchar_t *extra_local;
  wint_t nextc_local;
  wchar_t flags_local;
  wint_t c_local;
  wchar_t *dst_local;
  
  if (c == 10) {
LAB_0011a5ba:
    _flags_local = do_svis(dst,c,flags,nextc,extra);
  }
  else {
    iVar1 = iswspace(c);
    if ((iVar1 == 0) || ((nextc != 0xd && (nextc != 10)))) {
      iVar1 = iswspace(c);
      if ((iVar1 != 0) || ((0x20 < c && (((c < 0x3d || (0x3d < c)) && (c < 0x7f)))))) {
        pwVar2 = wcschr(L"#$@[\\]^`{|}~",c);
        if (pwVar2 == (wchar_t *)0x0) goto LAB_0011a5ba;
      }
    }
    *dst = L'=';
    dst[1] = L"0123456789ABCDEF"[c >> 4 & 0xf];
    _flags_local = dst + 3;
    dst[2] = L"0123456789ABCDEF"[c & 0xf];
  }
  return _flags_local;
}

Assistant:

static wchar_t *
do_mvis(wchar_t *dst, wint_t c, int flags, wint_t nextc, const wchar_t *extra)
{
	if ((c != L'\n') &&
	    /* Space at the end of the line */
	    ((iswspace(c) && (nextc == L'\r' || nextc == L'\n')) ||
	    /* Out of range */
	    (!iswspace(c) && (c < 33 || (c > 60 && c < 62) || c > 126)) ||
	    /* Specific char to be escaped */
	    wcschr(L"#$@[\\]^`{|}~", c) != NULL)) {
		*dst++ = L'=';
		*dst++ = XTOA(((unsigned int)c >> 4) & 0xf);
		*dst++ = XTOA((unsigned int)c & 0xf);
	} else
		dst = do_svis(dst, c, flags, nextc, extra);
	return dst;
}